

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::execAndEaRg<(moira::Instr)9,(moira::Mode)6,(moira::Size)4>(Moira *this,u16 opcode)

{
  u32 uVar1;
  undefined8 in_RAX;
  ulong uVar2;
  uint uVar3;
  bool error;
  bool local_21;
  
  local_21 = SUB81((ulong)in_RAX >> 0x38,0);
  uVar1 = computeEA<(moira::Mode)6,(moira::Size)4,0ul>(this,opcode & 7);
  uVar1 = readM<(moira::MemSpace)1,(moira::Size)4,128ul>(this,uVar1,&local_21);
  if (local_21 == false) {
    uVar2 = (ulong)(opcode >> 9 & 7);
    uVar3 = uVar1 & *(uint *)((long)this->exec + uVar2 * 4 + -0x58);
    (this->reg).sr.n = SUB41(uVar3 >> 0x1f,0);
    (this->reg).sr.z = uVar3 == 0;
    (this->reg).sr.v = false;
    (this->reg).sr.c = false;
    uVar1 = (this->reg).pc;
    (this->reg).pc0 = uVar1;
    (this->queue).ird = (this->queue).irc;
    uVar1 = readM<(moira::MemSpace)2,(moira::Size)2,4ul>(this,uVar1 + 2);
    (this->queue).irc = (u16)uVar1;
    (*this->_vptr_Moira[0x19])(this,2);
    *(uint *)((long)this->exec + uVar2 * 4 + -0x58) = uVar3;
  }
  return;
}

Assistant:

void
Moira::execAndEaRg(u16 opcode)
{
    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    u32 ea, data;
    if (!readOp<M,S, STD_AE_FRAME>(src, ea, data)) return;

    u32 result = logic<I,S>(data, readD<S>(dst));
    prefetch<POLLIPL>();

    if (S == Long) sync(isRegMode(M) || isImmMode(M) ? 4 : 2);
    writeD<S>(dst, result);
}